

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_key2text.c
# Opt level: O0

int ec_param_to_text(BIO *out,EC_GROUP *group,OSSL_LIB_CTX *libctx)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  OSSL_LIB_CTX *in_RSI;
  EC_GROUP *in_RDI;
  int curve_nid;
  char *curve_name;
  bool local_39;
  EC_GROUP *bio;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  uVar1 = EC_GROUP_get_asn1_flag((EC_GROUP *)in_RSI);
  if ((uVar1 & 1) == 0) {
    uVar1 = ec_param_explicit_to_text
                      ((BIO *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                       in_RSI);
  }
  else {
    iVar2 = EC_GROUP_get_curve_name((EC_GROUP *)in_RSI);
    if (iVar2 == 0) {
      uVar1 = 0;
    }
    else {
      bio = in_RDI;
      pcVar3 = OBJ_nid2sn(iVar2);
      iVar2 = BIO_printf((BIO *)in_RDI,"%s: %s\n","ASN1 OID",pcVar3);
      if (iVar2 < 1) {
        uVar1 = 0;
      }
      else {
        pcVar3 = EC_curve_nid2nist(0);
        local_39 = true;
        if (pcVar3 != (char *)0x0) {
          iVar2 = BIO_printf((BIO *)bio,"%s: %s\n","NIST CURVE",pcVar3);
          local_39 = 0 < iVar2;
        }
        uVar1 = (uint)local_39;
      }
    }
  }
  return uVar1;
}

Assistant:

static int ec_param_to_text(BIO *out, const EC_GROUP *group,
                            OSSL_LIB_CTX *libctx)
{
    if (EC_GROUP_get_asn1_flag(group) & OPENSSL_EC_NAMED_CURVE) {
        const char *curve_name;
        int curve_nid = EC_GROUP_get_curve_name(group);

        /* Explicit parameters */
        if (curve_nid == NID_undef)
            return 0;

        if (BIO_printf(out, "%s: %s\n", "ASN1 OID", OBJ_nid2sn(curve_nid)) <= 0)
            return 0;

        curve_name = EC_curve_nid2nist(curve_nid);
        return (curve_name == NULL
                || BIO_printf(out, "%s: %s\n", "NIST CURVE", curve_name) > 0);
    } else {
        return ec_param_explicit_to_text(out, group, libctx);
    }
}